

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator<char> *paVar1;
  __node_base_ptr *linkedInstances_;
  char **this;
  _Link_type other;
  Export *this_00;
  DataSegment *table;
  char *pcVar2;
  Memory *memory;
  Module *module;
  undefined1 auVar3 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Base_ptr p_Var8;
  undefined8 wasm_00;
  size_t sVar9;
  pointer pbVar10;
  _Head_base<0UL,_wasm::Module_*,_false> _Var11;
  char cVar12;
  bool bVar13;
  string *psVar14;
  mapped_type *pmVar15;
  Function *pFVar16;
  Expression *pEVar17;
  Table *pTVar18;
  Global *pGVar19;
  Const *pCVar20;
  Memory *pMVar21;
  element_type *peVar22;
  iterator iVar23;
  _Rb_tree_node_base *this_01;
  ulong uVar24;
  _Rb_tree_node_base *p_Var25;
  undefined1 auVar26 [8];
  ostream *poVar27;
  long lVar28;
  ArenaVector<wasm::Expression_*> *pAVar29;
  Type type;
  Expression **ppEVar30;
  Block *pBVar31;
  Expression *pEVar32;
  Block *pBVar33;
  undefined8 *puVar34;
  size_type sVar35;
  ModuleUtils *this_02;
  size_type sVar36;
  ArenaVector<wasm::Expression_*> *pAVar37;
  long extraout_RDX;
  Index i;
  int iVar39;
  Name *this_03;
  _Link_type __p;
  Literals *arguments;
  uint uVar40;
  iterator __pos;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar41;
  pointer puVar42;
  string *psVar43;
  Index *this_04;
  _Link_type other_00;
  Name newName;
  Name newName_00;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name NVar44;
  Name NVar45;
  Name NVar46;
  Name NVar47;
  Name NVar48;
  Name NVar49;
  Name NVar50;
  Name value;
  Name value_00;
  Name value_01;
  Name value_02;
  Name name_03;
  Name root;
  Name root_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar51;
  IString IVar52;
  undefined1 local_1260 [8];
  ToolOptions options;
  undefined1 local_1050 [8];
  CtorEvalExternalInterface interface;
  CtorEvalExternalInterface envInterface;
  Module wasm;
  _Any_data local_a78;
  code *local_a68;
  code *local_a60;
  undefined1 auStack_a58 [8];
  EvallingModuleRunner instance;
  FunctionScope scope;
  ModuleReader reader;
  undefined1 local_5d0 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keptExportsSet;
  string local_568 [32];
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408 [32];
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  local_3e8;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  undefined1 auStack_368 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> localSets;
  undefined1 auStack_318 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  undefined1 auStack_2f8 [8];
  Literals results_1;
  string local_2b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  IString local_278 [2];
  IString local_258 [2];
  undefined1 auStack_238 [8];
  Literals params;
  EvalCtorOutcome outcome;
  undefined1 local_1a8 [8];
  shared_ptr<(anonymous_namespace)::EvallingModuleRunner> envInstance;
  undefined1 auStack_188 [8];
  Split ctors;
  undefined1 auStack_168 [8];
  Split keptExports;
  string local_148 [8];
  string WasmCtorEvalOption;
  vector<wasm::Literals,_std::allocator<wasm::Literals>_> appliedLocals;
  undefined1 local_f8 [8];
  Iterator __begin2;
  undefined1 local_d8 [8];
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  linkedInstances;
  _Head_base<0UL,_wasm::Module_*,_false> local_88;
  unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> envModule;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  string *local_40;
  undefined1 local_32;
  undefined1 local_31 [7];
  bool emitBinary;
  bool debugInfo;
  ArenaVector<wasm::Expression_*> *pAVar38;
  
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_318 = (undefined1  [8])0x0;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_32 = 1;
  local_31[0] = 0;
  auStack_188 = (undefined1  [8])0x0;
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ctors.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_168 = (undefined1  [8])0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keptExports.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_148,"wasm-ctor-eval options",
             (allocator<char> *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),"wasm-ctor-eval",
             (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
  paVar1 = (allocator<char> *)
           ((long)&interface.seenDataStack.
                   super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                   .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_a58,"Execute code at compile time",paVar1);
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1260,
             (string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),(string *)auStack_a58);
  std::__cxx11::string::~string((string *)auStack_a58);
  std::__cxx11::string::~string
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),"--output",&local_56);
  std::__cxx11::string::string<std::allocator<char>>((string *)auStack_a58,"-o",&local_55);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&scope.currDelegateTarget.super_IString.str._M_str,
             "Output file (stdout if not specified)",&local_54);
  interface.seenDataStack.
  super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
  .flexible._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  envInterface.super_ExternalInterface._vptr_ExternalInterface = (_func_int **)0x0;
  envInterface.instance =
       (EvallingModuleRunner *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_invoke;
  envInterface.wasm =
       (Module *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:986:10)>
       ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      ((string *)local_1260,
                       (string *)
                       ((long)&envInterface.seenDataStack.
                               super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                               .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
                       (string *)auStack_a58,
                       (string *)&scope.currDelegateTarget.super_IString.str._M_str,
                       (Arguments)local_148,(function *)0x1,SUB81(paVar1,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1050,"--emit-text",&local_53);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"-S",&local_52);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_368,"Emit text instead of binary for the output file",&local_51);
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.linkedInstances._M_t.
  _M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_32;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_invoke;
  scope.locals.super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:995:10)>
                ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,(string *)local_1050,(string *)&options.enabledFeatures,
                       (string *)auStack_368,(Arguments)local_148,(function *)0x0,
                       (bool)((char)&instance + -0x48));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"--debuginfo",&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)auStack_238,"-g",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_2f8,"Emit names section and debug info",&local_4e);
  keptExportsSet._M_h._M_buckets = (__buckets_ptr)0x0;
  local_5d0 = (undefined1  [8])local_31;
  keptExportsSet._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_invoke;
  keptExportsSet._M_h._M_bucket_count =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1001:10)>
       ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,(string *)
                               &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)auStack_238,(string *)auStack_2f8,(Arguments)local_148,
                       (function *)0x0,SUB81(local_5d0,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"--ctors",&local_4d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"-c",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&keptExportsSet._M_h._M_single_bucket,
             "Comma-separated list of global constructor functions to evaluate",&local_4b);
  local_3b8._8_8_ = 0;
  local_3b8._M_unused._M_object = auStack_188;
  local_3a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1007:10)>
              ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,(string *)local_d8,(string *)&local_3e8,
                       (string *)&keptExportsSet._M_h._M_single_bucket,(Arguments)local_148,
                       (function *)0x1,SUB81(&local_3b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"--kept-exports",&local_4a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(WasmCtorEvalOption.field_2._M_local_buf + 8),"-ke",&local_49);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,
             "Comma-separated list of ctors whose exports we keep around even if we eval those ctors"
             ,&local_48);
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_1a8 = (undefined1  [8])auStack_168;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1017:7)>
       ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,local_2b8,(string *)(WasmCtorEvalOption.field_2._M_local_buf + 8),
                       (string *)local_f8,(Arguments)local_148,(function *)0x1,SUB81(local_1a8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input.field_2._M_local_buf + 8),"--ignore-external-input",&local_47);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_278,"-ipi",&local_46);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"Assumes no env vars are to be read, stdin is empty, etc.",
             &local_45);
  local_388._M_unused._M_object = (LocalSet *)0x0;
  local_388._8_8_ = 0;
  local_370 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1025:10)>
              ::_M_manager;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,(string *)(input.field_2._M_local_buf + 8),(string *)local_278,
                       (string *)local_258,(Arguments)local_148,(function *)0x0,SUB81(&local_388,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"--quiet",&local_44);
  std::__cxx11::string::string<std::allocator<char>>(local_568,"-q",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            (local_548,"Do not emit verbose logging about the eval process",&local_42);
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  psVar14 = (string *)
            ::wasm::Options::add
                      (psVar14,(string *)&local_88,local_568,local_548,(Arguments)local_148,
                       (function *)0x0,(bool)((char)&wasm + '@'));
  std::__cxx11::string::string<std::allocator<char>>(local_528,"INFILE",&local_41);
  local_a78._M_unused._M_object = (void *)0x0;
  local_a78._8_8_ = 0;
  local_a60 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_invoke;
  local_a68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-ctor-eval.cpp:1036:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar14,(Arguments)local_528,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_a78);
  std::__cxx11::string::~string(local_528);
  std::_Function_base::~_Function_base((_Function_base *)&wasm.tagsMap._M_h._M_single_bucket);
  std::__cxx11::string::~string(local_548);
  std::__cxx11::string::~string(local_568);
  std::__cxx11::string::~string((string *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_388);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)local_1a8);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)(WasmCtorEvalOption.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_2b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  std::__cxx11::string::~string((string *)&keptExportsSet._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)local_d8);
  std::_Function_base::~_Function_base((_Function_base *)local_5d0);
  std::__cxx11::string::~string((string *)auStack_2f8);
  std::__cxx11::string::~string((string *)auStack_238);
  std::__cxx11::string::~string
            ((string *)
             &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)auStack_368);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::~string((string *)local_1050);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  std::__cxx11::string::~string((string *)&scope.currDelegateTarget.super_IString.str._M_str);
  std::__cxx11::string::~string((string *)auStack_a58);
  std::__cxx11::string::~string
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  ::wasm::Options::parse((int)local_1260,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),"infile",
             (allocator<char> *)auStack_a58);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,
                         (key_type *)
                         ((long)&envInterface.seenDataStack.
                                 super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                 .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  ::wasm::read_file<std::__cxx11::string>(local_2b8,(BinaryOption)pmVar15);
  std::__cxx11::string::~string
            ((string *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  ::wasm::Module::Module
            ((Module *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  ::wasm::ToolOptions::applyFeatures
            ((ToolOptions *)local_1260,
             (Module *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  if (local_1260[0] == (Options)0x1) {
    std::operator<<((ostream *)&std::cout,"reading...\n");
  }
  reader._0_8_ = reader._0_8_ & 0xffffffffffffff00;
  scope.currDelegateTarget.super_IString.str._M_str =
       (char *)CONCAT62(CONCAT42(0,scope.currDelegateTarget.super_IString.str._M_str._2_2_),1);
  paVar1 = (allocator<char> *)
           ((long)&interface.seenDataStack.
                   super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                   .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)auStack_a58,"infile",paVar1);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&options,(key_type *)auStack_a58);
  std::__cxx11::string::string(local_508,(string *)pmVar15);
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"",(allocator<char> *)local_1050);
  ::wasm::ModuleReader::read
            (&scope.currDelegateTarget.super_IString.str._M_str,local_508,
             (size_t *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),local_4e8);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::string::~string((string *)auStack_a58);
  cVar12 = ::wasm::WasmValidator::validate((Module *)auStack_a58,(int)&envInterface + 0x130);
  if (cVar12 == '\0') {
    poVar27 = (ostream *)
              std::operator<<((ostream *)&std::cout,
                              (Module *)
                              ((long)&envInterface.seenDataStack.
                                      super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                      .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
    std::operator<<(poVar27,'\n');
    ::wasm::Fatal::Fatal((Fatal *)auStack_a58);
    ::wasm::Fatal::operator<<((Fatal *)auStack_a58,(char (*) [26])"error in validating input");
    goto LAB_00127f7a;
  }
  cVar12 = ::wasm::MemoryUtils::flatten
                     ((Module *)
                      ((long)&envInterface.seenDataStack.
                              super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                              .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  if (cVar12 == '\0') {
    if ((anonymous_namespace)::quiet == '\0') {
      std::operator<<((ostream *)&std::cout,"  ...stopping since could not flatten memory\n");
    }
    goto LAB_0012784c;
  }
  arguments = (Literals *)auStack_a58;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_5d0,auStack_168,
             keptExports.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,arguments,
             &scope.currDelegateTarget.super_IString.str._M_str,paVar1);
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&linkedInstances;
  linkedInstances._M_t._M_impl._0_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::make_unique<wasm::Module>();
  ::wasm::Name::Name((Name *)auStack_a58,"env");
  *(undefined4 *)&((local_88._M_head_impl)->name).super_IString.str._M_len = auStack_a58._0_4_;
  *(undefined4 *)((long)&((local_88._M_head_impl)->name).super_IString.str._M_len + 4) =
       auStack_a58._4_4_;
  *(undefined4 *)&((local_88._M_head_impl)->name).super_IString.str._M_str =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner.
       _0_4_;
  *(undefined4 *)((long)&((local_88._M_head_impl)->name).super_IString.str._M_str + 4) =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner.
       _4_4_;
  for (; _Var11._M_head_impl = local_88._M_head_impl,
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pointer)wasm.functions.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           wasm.exports.
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    this_00 = ((wasm.exports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if ((*(char **)&this_00->kind != (char *)0x0) &&
       (*(char **)&this_00->kind == ((local_88._M_head_impl)->name).super_IString.str._M_str)) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = arguments;
      pFVar16 = ::wasm::ModuleUtils::copyFunction
                          ((ModuleUtils *)this_00,(Function *)local_88._M_head_impl,(Module *)0x0,
                           (Name)(auVar3 << 0x40));
      (pFVar16->super_Importable).base.super_IString.str._M_len = 0;
      (pFVar16->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pFVar16->super_Importable).module.super_IString.str._M_len = 0;
      (pFVar16->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      pEVar17 = (Expression *)
                MixedArena::alloc<wasm::Unreachable>(&(_Var11._M_head_impl)->allocator);
      _Var11._M_head_impl = local_88._M_head_impl;
      pFVar16->body = pEVar17;
      arguments = (Literals *)(pFVar16->super_Importable).super_Named.name.super_IString.str._M_str;
      name.super_IString.str._M_str = *(char **)&this_00[1].name.super_IString;
      name.super_IString.str._M_len = (size_t)auStack_a58;
      value.super_IString.str._M_str =
           (char *)(pFVar16->super_Importable).super_Named.name.super_IString.str._M_len;
      value.super_IString.str._M_len = (size_t)*(char **)((long)&this_00[1].name.super_IString + 8);
      ::wasm::Builder::makeExport(name,value,(ExternalKind)arguments);
      ::wasm::Module::addExport((unique_ptr *)_Var11._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_a58);
    }
  }
  for (puVar41 = wasm.dataSegments.
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar41 !=
      (pointer)wasm.tables.
               super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; puVar41 = puVar41 + 1) {
    table = (puVar41->_M_t).
            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    pcVar2 = *(char **)((long)&(table->memory).super_IString + 8);
    if ((pcVar2 != (char *)0x0) &&
       (pcVar2 == ((local_88._M_head_impl)->name).super_IString.str._M_str)) {
      pTVar18 = ::wasm::ModuleUtils::copyTable((Table *)table,local_88._M_head_impl);
      _Var11._M_head_impl = local_88._M_head_impl;
      (pTVar18->super_Importable).base.super_IString.str._M_len = 0;
      (pTVar18->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pTVar18->super_Importable).module.super_IString.str._M_len = 0;
      (pTVar18->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      arguments = (Literals *)(pTVar18->super_Importable).super_Named.name.super_IString.str._M_str;
      name_00.super_IString.str._M_str =
           (char *)(((Name *)&table->isPassive)->super_IString).str._M_len;
      name_00.super_IString.str._M_len = (size_t)auStack_a58;
      value_00.super_IString.str._M_str =
           (char *)(pTVar18->super_Importable).super_Named.name.super_IString.str._M_len;
      value_00.super_IString.str._M_len = (size_t)table->offset;
      ::wasm::Builder::makeExport(name_00,value_00,(ExternalKind)arguments);
      ::wasm::Module::addExport((unique_ptr *)_Var11._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_a58);
    }
  }
  local_40 = (string *)
             wasm.globals.
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  for (psVar43 = (string *)
                 wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage; psVar43 != local_40;
      psVar43 = (string *)&psVar43->_M_string_length) {
    pFVar16 = (((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &(psVar43->_M_dataplus)._M_p)->_M_t).
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar2 = *(char **)((long)&(pFVar16->super_Importable).module + 8);
    if ((pcVar2 != (char *)0x0) &&
       (pcVar2 == ((local_88._M_head_impl)->name).super_IString.str._M_str)) {
      pGVar19 = ::wasm::ModuleUtils::copyGlobal((Global *)pFVar16,local_88._M_head_impl);
      (pGVar19->super_Importable).base.super_IString.str._M_len = 0;
      (pGVar19->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pGVar19->super_Importable).module.super_IString.str._M_len = 0;
      (pGVar19->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      scope.currDelegateTarget.super_IString.str._M_str = (char *)local_88._M_head_impl;
      ::wasm::Literal::makeZero((Type)auStack_a58);
      pCVar20 = ::wasm::Builder::makeConst
                          ((Builder *)&scope.currDelegateTarget.super_IString.str._M_str,
                           (Literal *)auStack_a58);
      pGVar19->init = (Expression *)pCVar20;
      ::wasm::Literal::~Literal((Literal *)auStack_a58);
      _Var11._M_head_impl = local_88._M_head_impl;
      arguments = (Literals *)(pGVar19->super_Importable).super_Named.name.super_IString.str._M_str;
      name_01.super_IString.str._M_str =
           (char *)(pFVar16->super_Importable).base.super_IString.str._M_len;
      name_01.super_IString.str._M_len =
           (size_t)((long)&interface.seenDataStack.
                           super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                           .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
      value_01.super_IString.str._M_str =
           (char *)(pGVar19->super_Importable).super_Named.name.super_IString.str._M_len;
      value_01.super_IString.str._M_len =
           (size_t)*(char **)((long)&(pFVar16->super_Importable).base + 8);
      ::wasm::Builder::makeExport(name_01,value_01,(ExternalKind)arguments);
      ::wasm::Module::addExport((unique_ptr *)_Var11._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                 ((long)&interface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
    }
  }
  for (puVar42 = wasm.elementSegments.
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar42 !=
      (pointer)wasm.memories.
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; puVar42 = puVar42 + 1) {
    memory = (Memory *)
             (puVar42->_M_t).
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
    pcVar2 = *(char **)((long)&memory->super_Importable + 0x20);
    if ((pcVar2 != (char *)0x0) &&
       (pcVar2 == ((local_88._M_head_impl)->name).super_IString.str._M_str)) {
      pMVar21 = ::wasm::ModuleUtils::copyMemory(memory,local_88._M_head_impl);
      _Var11._M_head_impl = local_88._M_head_impl;
      (pMVar21->super_Importable).base.super_IString.str._M_len = 0;
      (pMVar21->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      (pMVar21->super_Importable).module.super_IString.str._M_len = 0;
      (pMVar21->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      arguments = (Literals *)(pMVar21->super_Importable).super_Named.name.super_IString.str._M_str;
      name_02.super_IString.str._M_str =
           (char *)(((Name *)((long)&memory->super_Importable + 0x28))->super_IString).str._M_len;
      name_02.super_IString.str._M_len = (size_t)auStack_a58;
      value_02.super_IString.str._M_str =
           (char *)(pMVar21->super_Importable).super_Named.name.super_IString.str._M_len;
      value_02.super_IString.str._M_len = (size_t)*(char **)((long)&memory->super_Importable + 0x30)
      ;
      ::wasm::Builder::makeExport(name_02,value_02,(ExternalKind)arguments);
      ::wasm::Module::addExport((unique_ptr *)_Var11._M_head_impl);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auStack_a58);
    }
  }
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3e8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3e8._M_t._M_impl._0_8_ = 0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  anon_unknown.dwarf_4d369::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),&local_3e8);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map(&local_3e8);
  _Var11._M_head_impl = local_88._M_head_impl;
  local_1a8 = (undefined1  [8])0x0;
  peVar22 = (element_type *)operator_new(0x2d0);
  scope.currDelegateTarget.super_IString.str._M_str = local_1050;
  (peVar22->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x100000001
  ;
  (peVar22->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0015bc60;
  this_04 = &(peVar22->super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>).
             super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ = &instance;
  auStack_a58 = (undefined1  [8])0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
       (_func_int **)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm = (Module *)0x0;
  instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
  super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_ =
       instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
       super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_;
  reader._0_8_ = peVar22;
  anon_unknown.dwarf_4d369::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)this_04,_Var11._M_head_impl,
             (ExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)auStack_a58);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)auStack_a58);
  reader.super_ModuleIOBase.debugInfo = false;
  reader.DWARF = false;
  reader._2_2_ = 0;
  reader.profile = Normal;
  local_1a8 = (undefined1  [8])this_04;
  envInstance.
  super___shared_ptr<(anonymous_namespace)::EvallingModuleRunner,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar22;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EvallingModuleRunner,_std::allocator<(anonymous_namespace)::EvallingModuleRunner>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::EvallingModuleRunner,_std::allocator<(anonymous_namespace)::EvallingModuleRunner>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&scope.currDelegateTarget.super_IString.str._M_str);
  this_03 = &(local_88._M_head_impl)->name;
  iVar23 = std::
           map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
           ::lower_bound((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                          *)local_d8,this_03);
  pVar4.second = iVar23._M_node;
  pVar4.first = iVar23._M_node;
  if ((iVar23._M_node == (_Base_ptr)&linkedInstances) ||
     (bVar13 = ::wasm::IString::operator<(&this_03->super_IString,(IString *)(iVar23._M_node + 1)),
     bVar13)) {
    this_01 = (_Rb_tree_node_base *)operator_new(0x40);
    other_00 = (_Link_type)(this_01 + 1);
    p_Var8 = (_Base_ptr)((local_88._M_head_impl)->name).super_IString.str._M_str;
    *(size_t *)(this_01 + 1) = (this_03->super_IString).str._M_len;
    this_01[1]._M_parent = p_Var8;
    this_01[1]._M_left = (_Base_ptr)0x0;
    this_01[1]._M_right = (_Base_ptr)0x0;
    if (iVar23._M_node == (_Base_ptr)&linkedInstances) {
      if ((linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
         || (__p = other_00,
            bVar13 = ::wasm::IString::operator<
                               ((IString *)
                                (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left + 1),(IString *)other_00), !bVar13)) {
LAB_00126cba:
        __p = other_00;
        pVar51 = std::
                 _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                             *)local_d8,(key_type *)other_00);
      }
      else {
LAB_00126cce:
        auVar5._8_8_ = 0;
        auVar5._0_8_ = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pVar51 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar5 << 0x40);
      }
LAB_00126cd1:
      iVar23._M_node = pVar51.first;
      if (pVar51.second == (_Rb_tree_node_base *)0x0) {
LAB_00126d19:
        std::
        _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
        ::_M_drop_node((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                        *)this_01,__p);
        goto LAB_00126d24;
      }
    }
    else {
      other = (_Link_type)(iVar23._M_node + 1);
      __p = other;
      bVar13 = ::wasm::IString::operator<((IString *)other_00,(IString *)other);
      if (!bVar13) {
        __p = other_00;
        bVar13 = ::wasm::IString::operator<((IString *)other,(IString *)other_00);
        if (bVar13) {
          if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_left == iVar23._M_node
             ) goto LAB_00126cce;
          p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar23._M_node);
          pVar51.second = p_Var25;
          pVar51.first = p_Var25;
          __p = (_Link_type)(p_Var25 + 1);
          bVar13 = ::wasm::IString::operator<((IString *)other_00,(IString *)__p);
          if (!bVar13) goto LAB_00126cba;
          if ((iVar23._M_node)->_M_right == (_Base_ptr)0x0) {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = iVar23._M_node;
            pVar51 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar7 << 0x40);
            goto LAB_00126cdc;
          }
          goto LAB_00126cd1;
        }
        goto LAB_00126d19;
      }
      pVar51.second = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pVar51.first = linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == iVar23._M_node)
      goto LAB_00126cd1;
      uVar24 = std::_Rb_tree_decrement(iVar23._M_node);
      __p = other_00;
      bVar13 = ::wasm::IString::operator<((IString *)(uVar24 + 0x20),(IString *)other_00);
      if (!bVar13) goto LAB_00126cba;
      pVar51 = pVar4;
      if (*(long *)(uVar24 + 0x18) != 0) goto LAB_00126cd1;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar24;
      pVar51 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
    }
LAB_00126cdc:
    p_Var25 = pVar51.second;
    bVar13 = true;
    if (((_Rb_tree_node_base *)&linkedInstances != p_Var25) &&
       (pVar51.first == (_Rb_tree_node_base *)0x0)) {
      bVar13 = ::wasm::IString::operator<((IString *)other_00,(IString *)(p_Var25 + 1));
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar13,this_01,p_Var25,(_Rb_tree_node_base *)&linkedInstances);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((long)&(linkedInstances._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color +
         1);
    iVar23._M_node = this_01;
  }
LAB_00126d24:
  iVar23._M_node[1]._M_left = (_Base_ptr)local_1a8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar23._M_node[1]._M_right,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&keptExportsSet._M_h._M_single_bucket,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_d8);
  linkedInstances_ = &keptExportsSet._M_h._M_single_bucket;
  anon_unknown.dwarf_4d369::CtorEvalExternalInterface::CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)local_1050,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)linkedInstances_);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)linkedInstances_);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)&local_3b8,
        (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
         *)local_d8);
  anon_unknown.dwarf_4d369::EvallingModuleRunner::EvallingModuleRunner
            ((EvallingModuleRunner *)auStack_a58,
             (Module *)
             ((long)&envInterface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),
             (ExternalInterface *)local_1050,
             (map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              *)&local_3b8);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)&local_3b8);
  pbVar10 = ctors.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this = &scope.currDelegateTarget.super_IString.str._M_str;
  auVar26 = auStack_188;
  while (auVar26 != (undefined1  [8])pbVar10) {
    local_40 = (string *)auVar26;
    if ((anonymous_namespace)::quiet == '\0') {
      poVar27 = std::operator<<((ostream *)&std::cout,"trying to eval ");
      poVar27 = std::operator<<(poVar27,(string *)local_40);
      std::operator<<(poVar27,'\n');
    }
    ::wasm::IString::IString((IString *)((long)&input.field_2 + 8),local_40);
    NVar44.super_IString.str._M_str = (char *)input.field_2._8_8_;
    NVar44.super_IString.str._M_len =
         (size_t)((long)&envInterface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
    lVar28 = ::wasm::Module::getExportOrNull(NVar44);
    if (lVar28 == 0) {
      ::wasm::Fatal::Fatal((Fatal *)&scope.currDelegateTarget.super_IString.str._M_str);
      std::operator<<((ostream *)&reader.skipFunctionBodies,"export not found: ");
      ::wasm::Fatal::operator<<
                ((Fatal *)&scope.currDelegateTarget.super_IString.str._M_str,local_40);
      ::wasm::Fatal::~Fatal((Fatal *)&scope.currDelegateTarget.super_IString.str._M_str);
    }
    module = *(Module **)(lVar28 + 0x10);
    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(lVar28 + 0x18);
    ::wasm::IString::IString(local_278,local_40);
    sVar9 = local_278[0].str._M_len;
    wasm_00 = instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
    NVar45.super_IString.str._M_str = (char *)module;
    NVar45.super_IString.str._M_len =
         instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
         super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._24_8_;
    pFVar16 = (Function *)::wasm::Module::getFunction(NVar45);
    lVar28 = ::wasm::Function::getNumParams();
    if ((lVar28 != 0) && ((anonymous_namespace)::ignoreExternalInput == '\0')) {
      if ((anonymous_namespace)::quiet == '\0') {
        std::operator<<((ostream *)&std::cout,"  ...stopping due to params\n");
        std::operator<<((ostream *)&std::cout,
                        "\n       recommendation: consider --ignore-external-input");
      }
LAB_00127634:
      if ((anonymous_namespace)::quiet == '\0') {
        std::operator<<((ostream *)&std::cout,"  ...stopping\n");
      }
      std::_Optional_payload_base<wasm::Literals>::_M_reset
                ((_Optional_payload_base<wasm::Literals> *)
                 &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      break;
    }
    params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    params.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    params.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
    _M_str = (char *)0x0;
    auStack_238 = (undefined1  [8])0x0;
    params.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    params.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pAVar38 = (ArenaVector<wasm::Expression_*> *)0x0;
    while( true ) {
      pAVar29 = (ArenaVector<wasm::Expression_*> *)::wasm::Function::getNumParams();
      iVar39 = (int)pAVar38;
      if (pAVar29 <= pAVar38) break;
      type.id = ::wasm::Function::getLocalType((uint)pFVar16);
      bVar13 = ::wasm::LiteralUtils::canMakeZero(type);
      if (!bVar13) {
        if ((anonymous_namespace)::quiet == '\0') {
          std::operator<<((ostream *)&std::cout,"  ...stopping due to non-zeroable param\n");
        }
        outcome.super__Optional_base<wasm::Literals,_false,_false>._M_payload.
        super__Optional_payload<wasm::Literals,_true,_false,_false>.
        super__Optional_payload_base<wasm::Literals>._M_payload._48_1_ = 0;
        goto LAB_00127427;
      }
      ::wasm::Literal::makeZero((Type)this);
      ::wasm::SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_238,(Literal *)this);
      ::wasm::Literal::~Literal((Literal *)this);
      pAVar38 = (ArenaVector<wasm::Expression_*> *)(ulong)(iVar39 + 1);
    }
    pEVar17 = pFVar16->body;
    if (pEVar17->_id == BlockId) {
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
      FunctionScope((FunctionScope *)
                    &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                     linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count,pFVar16,
                    (Literals *)auStack_238,(EvallingModuleRunner *)auStack_a58);
      WasmCtorEvalOption.field_2._8_8_ = 0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)0x0;
      auStack_2f8 = (undefined1  [8])0x0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      results_1.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar38 = (ArenaVector<wasm::Expression_*> *)pEVar17[2].type.id;
      uVar40 = 0;
      local_f8 = (undefined1  [8])(pEVar17 + 2);
      while ((__begin2.parent != pAVar38 || (local_f8 != (undefined1  [8])(pEVar17 + 2)))) {
        ppEVar30 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)local_f8);
        stack0xfffffffffffff8b8 = (__buckets_ptr)0x0;
        scope.currDelegateTarget.super_IString.str._M_str = (char *)0x0;
        reader.super_ModuleIOBase.debugInfo = false;
        reader.DWARF = false;
        reader._2_2_ = 0;
        reader.profile = Normal;
        ::wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
                  ((Flow *)auStack_368,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_a58,
                   *ppEVar30);
        ::wasm::Flow::operator=((Flow *)this,(Flow *)auStack_368);
        ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_368);
        anon_unknown.dwarf_4d369::CtorEvalExternalInterface::applyToModule
                  ((CtorEvalExternalInterface *)local_1050);
        std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::operator=
                  ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
                   ((long)&WasmCtorEvalOption.field_2 + 8),
                   (vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
                   &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                    linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_2f8,
                   (SmallVector<wasm::Literal,_1UL> *)this);
        uVar40 = uVar40 + 1;
        ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)this);
        __begin2.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin2.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      pAVar29 = (ArenaVector<wasm::Expression_*> *)pEVar17[2].type.id;
      if (uVar40 == 0) {
        pAVar37 = (ArenaVector<wasm::Expression_*> *)0x0;
        pAVar38 = __begin2.parent;
      }
      else {
        pAVar37 = (ArenaVector<wasm::Expression_*> *)(ulong)uVar40;
        pAVar38 = pAVar37;
        if (pAVar37 < pAVar29) {
          root.super_IString.str._M_str._0_4_ = uVar40;
          root.super_IString.str._M_len =
               linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
          root.super_IString.str._M_str._4_4_ = 0;
          IVar52.str = (string_view)
                       ::wasm::Names::getValidFunctionName((Names *)wasm_00,module,root);
          pAVar38 = (ArenaVector<wasm::Expression_*> *)IVar52.str._M_str;
          newName.super_IString.str._M_str = (char *)arguments;
          newName.super_IString.str._M_len = (size_t)pAVar38;
          pFVar16 = ::wasm::ModuleUtils::copyFunction
                              ((ModuleUtils *)pFVar16,(Function *)wasm_00,
                               (Module *)IVar52.str._M_len,newName);
          NVar46.super_IString.str._M_str = (char *)sVar9;
          NVar46.super_IString.str._M_len = wasm_00;
          lVar28 = ::wasm::Module::getExport(NVar46);
          ((IString *)(lVar28 + 0x10))->str = IVar52.str;
          local_f8 = (undefined1  [8])wasm_00;
          pBVar31 = ::wasm::Expression::cast<wasm::Block>(pFVar16->body);
          for (pAVar29 = (ArenaVector<wasm::Expression_*> *)0x0; pAVar37 != pAVar29;
              pAVar29 = (ArenaVector<wasm::Expression_*> *)
                        ((long)&(pAVar29->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ).data + 1)) {
            pEVar32 = (Expression *)
                      MixedArena::alloc<wasm::Nop>((MixedArena *)((long)local_f8 + 0x158));
            ppEVar30 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       operator[](&(pBVar31->list).
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  ,(size_t)pAVar29);
            *ppEVar30 = pEVar32;
          }
          auStack_368 = (undefined1  [8])0x0;
          localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          localSets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar40 = 0;
          while( true ) {
            uVar24 = ::wasm::Function::getNumLocals();
            if (uVar24 <= uVar40) break;
            ::wasm::SmallVector<wasm::Literal,_1UL>::SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)this,
                       (SmallVector<wasm::Literal,_1UL> *)
                       ((ulong)uVar40 * 0x38 + WasmCtorEvalOption.field_2._8_8_));
            pAVar38 = (ArenaVector<wasm::Expression_*> *)0x0;
            pEVar32 = anon_unknown.dwarf_4d369::CtorEvalExternalInterface::getSerialization
                                ((CtorEvalExternalInterface *)local_1050,(Literals *)this,
                                 (Name)ZEXT816(0));
            local_388._M_unused._M_object =
                 ::wasm::Builder::makeLocalSet((Builder *)local_f8,uVar40,pEVar32);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_368,
                       (Expression **)&local_388);
            ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)this);
            uVar40 = uVar40 + 1;
          }
          pBVar33 = ::wasm::Builder::
                    makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                              ((Builder *)local_f8,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               auStack_368);
          ppEVar30 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                     operator[](&(pBVar31->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ,0);
          *ppEVar30 = (Expression *)pBVar33;
          ::wasm::PassOptions::getWithDefaultOptimizationOptions();
          ::wasm::PassRunner::PassRunner
                    ((PassRunner *)this,(Module *)wasm_00,(PassOptions *)&options.enabledFeatures);
          ::wasm::PassOptions::~PassOptions((PassOptions *)&options.enabledFeatures);
          ::wasm::PassRunner::addDefaultFunctionOptimizationPasses();
          ::wasm::PassRunner::runOnFunction((Function *)this);
          ::wasm::PassRunner::~PassRunner((PassRunner *)this);
          std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     auStack_368);
          pAVar29 = (ArenaVector<wasm::Expression_*> *)pEVar17[2].type.id;
        }
      }
      if (pAVar29 == pAVar37) {
        std::_Optional_payload_base<wasm::Literals>::_Optional_payload_base<wasm::Literals&>
                  ((_Optional_payload_base<wasm::Literals> *)
                   &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,auStack_2f8);
      }
      else {
        outcome.super__Optional_base<wasm::Literals,_false,_false>._M_payload.
        super__Optional_payload<wasm::Literals,_true,_false,_false>.
        super__Optional_payload_base<wasm::Literals>._M_payload._48_1_ = 0;
      }
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_2f8);
      std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
                ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)
                 ((long)&WasmCtorEvalOption.field_2 + 8));
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::FunctionScope::
      ~FunctionScope((FunctionScope *)
                     &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
                      linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    else {
      stack0xfffffffffffff8b8 = (__buckets_ptr)0x0;
      scope.currDelegateTarget.super_IString.str._M_str = (char *)0x0;
      reader.super_ModuleIOBase.debugInfo = false;
      reader.DWARF = false;
      reader._2_2_ = 0;
      reader.profile = Normal;
      arguments = (Literals *)auStack_238;
      name_03.super_IString.str._M_str =
           (char *)linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
      name_03.super_IString.str._M_len = (size_t)module;
      pAVar38 = (ArenaVector<wasm::Expression_*> *)
                linkedInstances._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
                ((Literals *)auStack_368,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_a58,
                 name_03,arguments);
      ::wasm::SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)this,
                 (SmallVector<wasm::Literal,_1UL> *)auStack_368);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)auStack_368);
      anon_unknown.dwarf_4d369::CtorEvalExternalInterface::applyToModule
                ((CtorEvalExternalInterface *)local_1050);
      std::_Optional_payload_base<wasm::Literals>::_Optional_payload_base<wasm::Literals&>
                ((_Optional_payload_base<wasm::Literals> *)
                 &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,this);
      ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)this)
      ;
    }
LAB_00127427:
    ::wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_238);
    if ((outcome.super__Optional_base<wasm::Literals,_false,_false>._M_payload.
         super__Optional_payload<wasm::Literals,_true,_false,_false>.
         super__Optional_payload_base<wasm::Literals>._M_payload._48_1_ & 1) == 0)
    goto LAB_00127634;
    if ((anonymous_namespace)::quiet == '\0') {
      poVar27 = std::operator<<((ostream *)&std::cout,"  ...success on ");
      poVar27 = std::operator<<(poVar27,(string *)local_40);
      std::operator<<(poVar27,".\n");
    }
    ::wasm::IString::IString(local_258,local_40);
    NVar47.super_IString.str._M_str = (char *)local_258[0].str._M_len;
    NVar47.super_IString.str._M_len =
         (size_t)((long)&envInterface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
    puVar34 = (undefined8 *)::wasm::Module::getExport(NVar47);
    sVar35 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)local_5d0,local_40);
    if (sVar35 == 0) {
      NVar49.super_IString.str._M_str = (char *)*puVar34;
      NVar49.super_IString.str._M_len =
           (size_t)((long)&envInterface.seenDataStack.
                           super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                           .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
      ::wasm::Module::removeExport(NVar49);
    }
    else {
      pFVar16 = (Function *)
                ((long)&envInterface.seenDataStack.
                        super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                        .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
      NVar48.super_IString.str._M_str = (char *)puVar34[2];
      NVar48.super_IString.str._M_len = (size_t)pFVar16;
      this_02 = (ModuleUtils *)::wasm::Module::getFunction(NVar48);
      root_00.super_IString.str._M_str = (char *)pAVar38;
      root_00.super_IString.str._M_len = *(size_t *)(this_02 + 8);
      IVar52.str = (string_view)
                   ::wasm::Names::getValidFunctionName((Names *)pFVar16,*(Module **)this_02,root_00)
      ;
      newName_00.super_IString.str._M_str = (char *)arguments;
      newName_00.super_IString.str._M_len = (size_t)IVar52.str._M_str;
      pFVar16 = ::wasm::ModuleUtils::copyFunction
                          (this_02,pFVar16,(Module *)IVar52.str._M_len,newName_00);
      ::wasm::HeapType::getSignature();
      if (extraout_RDX == 0) {
        pEVar17 = (Expression *)
                  MixedArena::alloc<wasm::Nop>((MixedArena *)&wasm.typeNames._M_h._M_single_bucket);
      }
      else {
        pEVar17 = anon_unknown.dwarf_4d369::CtorEvalExternalInterface::getSerialization
                            ((CtorEvalExternalInterface *)local_1050,
                             (Literals *)
                             &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(Name)ZEXT816(0));
      }
      pFVar16->body = pEVar17;
      NVar50.super_IString.str._M_str = (char *)*puVar34;
      NVar50.super_IString.str._M_len =
           (size_t)((long)&envInterface.seenDataStack.
                           super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                           .flexible._M_t._M_impl.super__Rb_tree_header + 0x20);
      lVar28 = ::wasm::Module::getExport(NVar50);
      ((IString *)(lVar28 + 0x10))->str = IVar52.str;
    }
    std::_Optional_payload_base<wasm::Literals>::_M_reset
              ((_Optional_payload_base<wasm::Literals> *)
               &params.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    auVar26 = (undefined1  [8])(local_40 + 1);
  }
  ::wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_a58);
  anon_unknown.dwarf_4d369::CtorEvalExternalInterface::~CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)local_1050);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&envInstance);
  anon_unknown.dwarf_4d369::CtorEvalExternalInterface::~CtorEvalExternalInterface
            ((CtorEvalExternalInterface *)
             ((long)&interface.seenDataStack.
                     super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                     .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            ((unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_> *)&local_88);
  std::
  map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
  ::~map((map<wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
          *)local_d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_5d0);
  cVar12 = ::wasm::WasmValidator::validate((Module *)auStack_a58,(int)&envInterface + 0x130);
  if (cVar12 != '\0') {
    ::wasm::PassRunner::PassRunner
              ((PassRunner *)auStack_a58,
               (Module *)
               ((long)&envInterface.seenDataStack.
                       super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                       .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"memory-packing",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"remove-unused-names",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"dce",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_488);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"merge-blocks",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"vacuum",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"remove-unused-module-elements",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    ::wasm::PassRunner::add((PassRunner *)auStack_a58,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    ::wasm::PassRunner::run();
    ::wasm::PassRunner::~PassRunner((PassRunner *)auStack_a58);
LAB_0012784c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_a58,"output",
               (allocator<char> *)&scope.currDelegateTarget.super_IString.str._M_str);
    sVar36 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&options,(key_type *)auStack_a58);
    std::__cxx11::string::~string((string *)auStack_a58);
    if (sVar36 != 0) {
      if (local_1260[0] == (Options)0x1) {
        poVar27 = std::operator<<((ostream *)&std::cout,"writing...");
        std::endl<char,std::char_traits<char>>(poVar27);
      }
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._vptr_ExpressionRunner =
           (_func_int **)
           &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
            super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.maxDepth;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>.module = (Module *)0x0;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
      super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ =
           instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.
           super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>._16_8_ &
           0xffffffffffffff00;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.wasm =
           (Module *)
           &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals.
            _M_t._M_impl.super__Rb_tree_header;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals._M_t.
      _M_impl._0_8_ = 0;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           &instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals.
            _M_t._M_impl.super__Rb_tree_header._M_node_count;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      instance.super_ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>.globals._M_t.
      _M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
      auStack_a58 = (undefined1  [8])
                    (CONCAT71(CONCAT61(auStack_a58._2_6_,local_32),local_31[0]) & 0xffffffffff00ffff
                    );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&scope.currDelegateTarget.super_IString.str._M_str,"output",
                 (allocator<char> *)
                 ((long)&interface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&options,
                             (key_type *)&scope.currDelegateTarget.super_IString.str._M_str);
      std::__cxx11::string::string(local_408,(string *)pmVar15);
      ::wasm::ModuleWriter::write
                (auStack_a58,
                 (size_t *)
                 ((long)&envInterface.seenDataStack.
                         super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                         .flexible._M_t._M_impl.super__Rb_tree_header + 0x20),local_408);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string((string *)&scope.currDelegateTarget.super_IString.str._M_str);
      ::wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)auStack_a58);
    }
    ::wasm::Module::~Module
              ((Module *)
               ((long)&envInterface.seenDataStack.
                       super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                       .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
    std::__cxx11::string::~string(local_2b8);
    ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1260);
    std::__cxx11::string::~string(local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_318);
    return 0;
  }
  poVar27 = (ostream *)
            std::operator<<((ostream *)&std::cout,
                            (Module *)
                            ((long)&envInterface.seenDataStack.
                                    super_SmallSetBase<wasm::GCData_*,_2UL,_wasm::OrderedFixedStorage<wasm::GCData_*,_2UL>,_std::set<wasm::GCData_*,_std::less<wasm::GCData_*>,_std::allocator<wasm::GCData_*>_>_>
                                    .flexible._M_t._M_impl.super__Rb_tree_header + 0x20));
  std::operator<<(poVar27,'\n');
  ::wasm::Fatal::Fatal((Fatal *)auStack_a58);
  ::wasm::Fatal::operator<<((Fatal *)auStack_a58,(char (*) [27])"error in validating output");
LAB_00127f7a:
  ::wasm::Fatal::~Fatal((Fatal *)auStack_a58);
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::vector<std::string> passes;
  bool emitBinary = true;
  bool debugInfo = false;
  String::Split ctors;
  String::Split keptExports;

  const std::string WasmCtorEvalOption = "wasm-ctor-eval options";

  ToolOptions options("wasm-ctor-eval", "Execute code at compile time");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--ctors",
         "-c",
         "Comma-separated list of global constructor functions to evaluate",
         WasmCtorEvalOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           ctors = String::Split(argument, ",");
         })
    .add(
      "--kept-exports",
      "-ke",
      "Comma-separated list of ctors whose exports we keep around even if we "
      "eval those ctors",
      WasmCtorEvalOption,
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) {
        keptExports = String::Split(argument, ",");
      })
    .add("--ignore-external-input",
         "-ipi",
         "Assumes no env vars are to be read, stdin is empty, etc.",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           ignoreExternalInput = true;
         })
    .add("--quiet",
         "-q",
         "Do not emit verbose logging about the eval process",
         WasmCtorEvalOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { quiet = true; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyFeatures(wasm);

  {
    if (options.debug) {
      std::cout << "reading...\n";
    }
    ModuleReader reader;
    try {
      reader.read(options.extra["infile"], wasm);
    } catch (ParseException& p) {
      p.dump(std::cout);
      Fatal() << "error in parsing input";
    }
  }

  if (!WasmValidator().validate(wasm)) {
    std::cout << wasm << '\n';
    Fatal() << "error in validating input";
  }

  if (canEval(wasm)) {
    evalCtors(wasm, ctors, keptExports);

    if (!WasmValidator().validate(wasm)) {
      std::cout << wasm << '\n';
      Fatal() << "error in validating output";
    }

    // Do some useful optimizations after the evalling
    {
      PassRunner passRunner(&wasm);
      passRunner.add("memory-packing"); // we flattened it, so re-optimize
      // TODO: just do -Os for the one function
      passRunner.add("remove-unused-names");
      passRunner.add("dce");
      passRunner.add("merge-blocks");
      passRunner.add("vacuum");
      passRunner.add("remove-unused-module-elements");
      passRunner.run();
    }
  }

  if (options.extra.count("output") > 0) {
    if (options.debug) {
      std::cout << "writing..." << std::endl;
    }
    ModuleWriter writer;
    writer.setBinary(emitBinary);
    writer.setDebugInfo(debugInfo);
    writer.write(wasm, options.extra["output"]);
  }
}